

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O0

int updateEntry(DdManager *table,DdHalfWord *order,int level,int cost,DdHalfWord **orders,int *costs
               ,int subsets,char *mask,int lower,int upper)

{
  int iVar1;
  int iVar2;
  DdHalfWord *subset;
  int local_38;
  int size;
  int j;
  int i;
  int *costs_local;
  DdHalfWord **orders_local;
  int cost_local;
  int level_local;
  DdHalfWord *order_local;
  DdManager *table_local;
  
  iVar2 = (upper - lower) + 1;
  for (size = lower; iVar1 = level, size <= upper; size = size + 1) {
    mask[table->invperm[size]] = '\0';
  }
  while (size = iVar1, size < iVar2) {
    mask[order[size]] = '\x01';
    iVar1 = size + 1;
  }
  for (size = 0; size < subsets; size = size + 1) {
    local_38 = level;
    while ((local_38 < iVar2 && (mask[orders[size][local_38]] != '\0'))) {
      local_38 = local_38 + 1;
    }
    if (local_38 == iVar2) break;
  }
  if ((size == subsets) || (cost < costs[size])) {
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      orders[size][local_38] = order[local_38];
    }
    costs[size] = cost;
    subsets = (uint)(size == subsets) + subsets;
  }
  return subsets;
}

Assistant:

static int
updateEntry(
  DdManager * table,
  DdHalfWord * order,
  int  level,
  int  cost,
  DdHalfWord ** orders,
  int * costs,
  int  subsets,
  char * mask,
  int  lower,
  int  upper)
{
    int i, j;
    int size = upper - lower + 1;

    /* Build a mask that says what variables are in this subset. */
    for (i = lower; i <= upper; i++)
        mask[table->invperm[i]] = 0;
    for (i = level; i < size; i++)
        mask[order[i]] = 1;

    /* Check each subset until a match is found or all subsets are examined. */
    for (i = 0; i < subsets; i++) {
        DdHalfWord *subset = orders[i];
        for (j = level; j < size; j++) {
            if (mask[subset[j]] == 0)
                break;
        }
        if (j == size)          /* no mismatches: success */
            break;
    }
    if (i == subsets || cost < costs[i]) {              /* add or replace */
        for (j = 0; j < size; j++)
            orders[i][j] = order[j];
        costs[i] = cost;
        subsets += (i == subsets);
    }
    return(subsets);

}